

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::f_ftod(Forth *this)

{
  anon_union_8_4_a234c5df_for_data_ local_20;
  DCell d1;
  double n2;
  Forth *this_local;
  
  requireFStackDepth(this,1,"F>D");
  requireDStackAvailable(this,2,"F>D");
  d1.data_ = (anon_union_8_4_a234c5df_for_data_)ForthStack<double>::getTop(&this->fStack);
  ForthStack<double>::pop(&this->fStack);
  DCell::DCell((DCell *)&local_20.Cells,
               (long)(double)d1.data_ |
               (long)((double)d1.data_ - 9.223372036854776e+18) & (long)(double)d1.data_ >> 0x3f);
  ForthStack<unsigned_int>::push(&this->dStack,local_20.Cells.lo);
  ForthStack<unsigned_int>::push(&this->dStack,local_20.Cells.hi);
  return;
}

Assistant:

void f_ftod(){
			REQUIRE_FSTACK_DEPTH(1, "F>D");
			REQUIRE_DSTACK_AVAILABLE(2, "F>D");
			auto n2 = fStack.getTop(); fStack.pop();
			DCell d1(n2);
			dStack.push(d1.data_.Cells.lo);
			dStack.push(d1.data_.Cells.hi);
		}